

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:549:62)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:549:62)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  char (*in_RCX) [15];
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> depResult;
  Maybe<capnp::MessageReaderAndFds> local_580;
  String local_558;
  ExceptionOr<capnp::MessageReaderAndFds> local_540;
  ExceptionOrValue local_380;
  char local_1e8;
  Maybe<capnp::MessageReaderAndFds> local_1e0;
  Exception local_1b8;
  
  local_380.exception.ptr.isSet = false;
  local_1e8 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_380);
  uVar1 = local_380.exception.ptr.field_1.value.context.ptr.ptr;
  if (local_380.exception.ptr.isSet == true) {
    local_540.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_380.exception.ptr.field_1.value.ownFile.content.ptr;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_380.exception.ptr.field_1.value.ownFile.content.size_;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_380.exception.ptr.field_1.value.ownFile.content.disposer;
    local_380.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_380.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_380.exception.ptr.field_1.value.file;
    local_540.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_380.exception.ptr.field_1._32_8_;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_380.exception.ptr.field_1.value.description.content.ptr;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_380.exception.ptr.field_1.value.description.content.size_;
    local_380.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_380.exception.ptr.field_1.value.description.content.size_ = 0;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_380.exception.ptr.field_1.value.description.content.disposer;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_380.exception.ptr.field_1.value.context.ptr.disposer;
    local_380.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar1;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_380.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_380.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_380.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_380.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_380.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_540.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_380.exception.ptr.field_1 + 0x68),0x105);
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_380.exception.ptr.field_1.value.details.builder.ptr;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_380.exception.ptr.field_1.value.details.builder.pos;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_380.exception.ptr.field_1.value.details.builder.endPtr;
    local_540.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_380.exception.ptr.field_1.value.details.builder.disposer;
    local_380.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_380.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_380.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_540.value.ptr.isSet = false;
    ExceptionOr<capnp::MessageReaderAndFds>::operator=
              ((ExceptionOr<capnp::MessageReaderAndFds> *)output,&local_540);
    uVar1 = local_540.value.ptr.field_1.value.reader.ptr;
    if ((local_540.value.ptr.isSet == true) &&
       (local_540.value.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
      local_540.value.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
      (**(local_540.value.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
                (local_540.value.ptr.field_1.value.reader.disposer,
                 (code *)((long)((MessageReader *)uVar1)->arenaSpace +
                         (long)(((MessageReader *)uVar1)->_vptr_MessageReader[-2] + -0x18)));
    }
  }
  else {
    if (local_1e8 != '\x01') goto LAB_002fbf48;
    Maybe<capnp::MessageReaderAndFds>::Maybe(&local_580,&local_1e0);
    if (local_580.ptr.isSet == false) {
      Debug::makeDescription<char_const(&)[15]>
                (&local_558,(Debug *)"\"Premature EOF.\"","Premature EOF.",in_RCX);
      Exception::Exception
                (&local_1b8,DISCONNECTED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++"
                 ,0x229,&local_558);
      throwRecoverableException(&local_1b8,0);
      Exception::~Exception(&local_1b8);
      String::~String(&local_558);
      unreachable();
    }
    local_540.value.ptr.field_1.value.fds.ptr = local_580.ptr.field_1.value.fds.ptr;
    local_540.value.ptr.field_1.value.fds.size_ = local_580.ptr.field_1.value.fds.size_;
    local_540.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_540.value.ptr.isSet = true;
    local_540.value.ptr.field_1.value.reader.disposer = local_580.ptr.field_1.value.reader.disposer;
    local_540.value.ptr.field_1.value.reader.ptr = local_580.ptr.field_1.value.reader.ptr;
    ExceptionOr<capnp::MessageReaderAndFds>::operator=
              ((ExceptionOr<capnp::MessageReaderAndFds> *)output,&local_540);
    uVar1 = local_540.value.ptr.field_1.value.reader.ptr;
    if ((local_540.value.ptr.isSet == true) &&
       (local_540.value.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
      local_540.value.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
      (**(local_540.value.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
                (local_540.value.ptr.field_1.value.reader.disposer,
                 (code *)((long)((MessageReader *)uVar1)->arenaSpace +
                         (long)(((MessageReader *)uVar1)->_vptr_MessageReader[-2] + -0x18)));
    }
  }
  if (local_540.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_540.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_002fbf48:
  uVar1 = local_1e0.ptr.field_1.value.reader.ptr;
  if (((local_1e8 == '\x01') && (local_1e0.ptr.isSet == true)) &&
     (local_1e0.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
    local_1e0.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
    (**(local_1e0.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
              (local_1e0.ptr.field_1.value.reader.disposer,
               (code *)((long)((MessageReader *)uVar1)->arenaSpace +
                       (long)(((MessageReader *)uVar1)->_vptr_MessageReader[-2] + -0x18)));
  }
  if (local_380.exception.ptr.isSet == true) {
    Exception::~Exception(&local_380.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }